

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

uint32_t __thiscall Catch::anon_unknown_1::TestHasher::operator()(TestHasher *this,TestCase *t)

{
  bool bVar1;
  reference pcVar2;
  long lVar3;
  uint32_t high;
  uint32_t low;
  char c;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  hash_t hash;
  hash_t prime;
  TestCase *t_local;
  TestHasher *this_local;
  
  __range2 = (string *)0xcbf29ce484222325;
  __end2 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           begin((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t);
  _low = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      (&__end2,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&low);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    __range2 = (string *)(((long)*pcVar2 ^ (ulong)__range2) * 0x100000001b3);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  lVar3 = (this->m_hashSuffix ^ (ulong)__range2) * 0x100000001b3;
  return (int)lVar3 * (int)((ulong)lVar3 >> 0x20);
}

Assistant:

uint32_t operator()( TestCase const& t ) const {
                // FNV-1a hash with multiplication fold.
                const hash_t prime = 1099511628211u;
                hash_t hash = 14695981039346656037u;
                for ( const char c : t.name ) {
                    hash ^= c;
                    hash *= prime;
                }
                hash ^= m_hashSuffix;
                hash *= prime;
                const uint32_t low{ static_cast<uint32_t>( hash ) };
                const uint32_t high{ static_cast<uint32_t>( hash >> 32 ) };
                return low * high;
            }